

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QPersistentModelIndex>>
          (QtPrivate *this,QDebug debug,char *which,QList<QPersistentModelIndex> *c)

{
  quintptr *pqVar1;
  unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *puVar2;
  char *pcVar3;
  QPersistentModelIndex *pQVar4;
  long lVar5;
  QString *pQVar6;
  QList<QPersistentModelIndex> *pQVar7;
  QString *this_00;
  QPersistentModelIndexData *this_01;
  QTextStream *pQVar8;
  QPersistentModelIndex *pQVar9;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  QPersistentModelIndex local_78;
  undefined1 local_70 [8];
  QPersistentModelIndex local_68;
  QDebug local_60;
  QDebugStateSaver local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  pQVar7 = c;
  QDebugStateSaver::QDebugStateSaver(&local_58,(QDebug *)debug.stream);
  pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  *(undefined1 *)&pQVar8[3]._vptr_QTextStream = 0;
  if (which == (char *)0x0) {
    this_00 = (QString *)0x0;
  }
  else {
    pQVar6 = (QString *)0xffffffffffffffff;
    do {
      this_00 = (QString *)((long)&(pQVar6->d).d + 1);
      pcVar3 = which + 1 + (long)pQVar6;
      pQVar6 = this_00;
    } while (*pcVar3 != '\0');
  }
  ba.m_data = (storage_type *)pQVar7;
  ba.m_size = (qsizetype)which;
  QString::fromUtf8(&local_50,this_00,ba);
  ::QTextStream::operator<<(pQVar8,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar8[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar8,' ');
    pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  }
  ::QTextStream::operator<<(pQVar8,'(');
  pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar8[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar8,' ');
  }
  pQVar4 = (c->d).ptr;
  lVar5 = (c->d).size;
  pQVar9 = pQVar4;
  if (lVar5 != 0) {
    local_68.d = (QPersistentModelIndexData *)((debug.stream)->ts)._vptr_QTextStream;
    pqVar1 = &local_68.d[1].index.i;
    *(int *)pqVar1 = (int)*pqVar1 + 1;
    ::operator<<((Stream *)&local_60,&local_68);
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug((QDebug *)&local_68);
    pQVar9 = pQVar4 + 1;
  }
  if (pQVar9 != pQVar4 + lVar5) {
    do {
      pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
      ba_00.m_data = (storage_type *)pQVar7;
      ba_00.m_size = (qsizetype)", ";
      QString::fromUtf8(&local_50,(QString *)0x2,ba_00);
      ::QTextStream::operator<<(pQVar8,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      this_01 = (QPersistentModelIndexData *)((debug.stream)->ts)._vptr_QTextStream;
      if (*(char *)&this_01[1].index.m.ptr == '\x01') {
        ::QTextStream::operator<<((QTextStream *)this_01,' ');
        this_01 = (QPersistentModelIndexData *)((debug.stream)->ts)._vptr_QTextStream;
      }
      puVar2 = (unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *)
               &this_01[1].index.i;
      *(int *)&(puVar2->_M_t).
               super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
               _M_t.
               super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
               .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
           *(int *)&(puVar2->_M_t).
                    super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
                    .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl + 1;
      local_78.d = this_01;
      ::operator<<((Stream *)local_70,&local_78);
      QDebug::~QDebug((QDebug *)local_70);
      QDebug::~QDebug((QDebug *)&local_78);
      pQVar9 = pQVar9 + 1;
    } while (pQVar9 != pQVar4 + lVar5);
  }
  ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,')');
  pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar8[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar8,' ');
    pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  }
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)0x0;
  *(QTextStream **)this = pQVar8;
  QDebugStateSaver::~QDebugStateSaver(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}